

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

void __thiscall Config::Load(Config *this)

{
  FILE *__stream;
  FileReadStream inputStream;
  char buffer [65536];
  FileReadStream FStack_10058;
  Ch aCStack_10018 [65536];
  
  __stream = fopen(this->_FilePath,"r");
  if (__stream != (FILE *)0x0) {
    FStack_10058.buffer_ = aCStack_10018;
    FStack_10058.bufferSize_ = 0x10000;
    FStack_10058.bufferLast_ = (Ch *)0x0;
    FStack_10058.readCount_ = 0;
    FStack_10058.count_ = 0;
    FStack_10058.eof_ = false;
    FStack_10058.fp_ = (FILE *)__stream;
    FStack_10058.current_ = FStack_10058.buffer_;
    rapidjson::FileReadStream::Read(&FStack_10058);
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
    ::ParseStream<0u,rapidjson::UTF8<char>,rapidjson::FileReadStream>
              ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                *)this,&FStack_10058);
    fclose(__stream);
    this->loaded = true;
  }
  return;
}

Assistant:

void Config::Load()
{
    FILE* fp = fopen(_FilePath,"r");
    if (fp == NULL)
        return;
    char buffer[65536];
    rapidjson::FileReadStream inputStream(fp,buffer, sizeof(buffer));
    Settings.ParseStream(inputStream);
    fclose(fp);
    loaded = true;
}